

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  uint uVar1;
  cmCTest *pcVar2;
  cmCTestTestProperties *pcVar3;
  char *pcVar4;
  char *__s;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ostream *poVar9;
  cmProcess *pcVar10;
  string *psVar11;
  pointer pbVar12;
  double testTimeOut;
  string msg;
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  cmCTestTestProperties *local_1e8;
  string *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar8 = 0xe;
  if (total < 100) {
    lVar8 = (ulong)(9 < total) * 2 + 10;
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
  uVar1 = this->TestHandler->MaxIndex;
  lVar8 = 3;
  if (uVar1 < 100) {
    lVar8 = 2 - (ulong)(uVar1 < 10);
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar8;
  poVar9 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1bf,local_208._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  ComputeArguments(this);
  pcVar3 = this->TestProperties;
  pcVar4 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  (this->TestResult).Properties = pcVar3;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  local_1e0 = &(this->TestResult).CompletionStatus;
  std::__cxx11::string::_M_replace((ulong)local_1e0,0,pcVar4,0x593790);
  (this->TestResult).Status = 8;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  pcVar4 = (char *)(this->TestResult).Path._M_string_length;
  __s = (this->TestProperties->Directory)._M_dataplus._M_p;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&(this->TestResult).Path,0,pcVar4,(ulong)__s);
  pbVar12 = (pcVar3->Args).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = pcVar3;
  if (((ulong)((long)(pcVar3->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) ||
     (iVar7 = std::__cxx11::string::compare((char *)(pbVar12 + 1)), iVar7 != 0)) {
    pbVar12 = (this->TestProperties->RequiredFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar12 !=
        (this->TestProperties->RequiredFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1b0 = (string *)&(this->TestResult).Output;
      local_1b8 = &(this->TestResult).FullCommandLine;
      do {
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        pcVar5 = (pbVar12->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar5,pcVar5 + pbVar12->_M_string_length);
        bVar6 = cmsys::SystemTools::FileExists(local_208._M_dataplus._M_p);
        if (bVar6) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                     local_208.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          pcVar10 = (cmProcess *)operator_new(0xc0);
          cmProcess::cmProcess(pcVar10);
          this->TestProcess = pcVar10;
          poVar9 = this->TestHandler->LogFile;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"Unable to find required file: ",0x1e);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar2 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x1f2,(char *)local_1d8,false);
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8,local_1c8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,"Unable to find required file: ",&local_208);
          std::__cxx11::string::operator=(local_1b0,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          std::__cxx11::string::_M_replace
                    ((ulong)local_1b8,0,(char *)(this->TestResult).FullCommandLine._M_string_length,
                     0x5e5069);
          std::__cxx11::string::_M_replace
                    ((ulong)local_1e0,0,(char *)(this->TestResult).CompletionStatus._M_string_length
                     ,0x59380b);
          (this->TestResult).Status = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                     local_208.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar6) {
            return false;
          }
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               (this->TestProperties->RequiredFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    iVar7 = std::__cxx11::string::compare((char *)&this->ActualCommand);
    if (iVar7 == 0) {
      pcVar10 = (cmProcess *)operator_new(0xc0);
      cmProcess::cmProcess(pcVar10);
      this->TestProcess = pcVar10;
      poVar9 = this->TestHandler->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Unable to find executable: ",0x1b);
      pbVar12 = (local_1e8->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,pbVar12[1]._M_dataplus._M_p,pbVar12[1]._M_string_length);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
      pbVar12 = (local_1e8->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,pbVar12[1]._M_dataplus._M_p,
                          pbVar12[1]._M_string_length);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x203,local_208._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                 local_208.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Unable to find executable: ",
                     (local_1e8->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&(this->TestResult).FullCommandLine,0,
                 (char *)(this->TestResult).FullCommandLine._M_string_length,0x5e5069);
      std::__cxx11::string::_M_replace
                ((ulong)local_1e0,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                 0x59380b);
      (this->TestResult).Status = 0;
      return false;
    }
    cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
    std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    testTimeOut = ResolveTimeout(this);
    if (this->StopTimePassed == false) {
      bVar6 = ForkProcess(this,testTimeOut,this->TestProperties->ExplicitTimeout,
                          &this->TestProperties->Environment);
      return bVar6;
    }
  }
  else {
    pcVar10 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar10);
    this->TestProcess = pcVar10;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    psVar11 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar11->_M_string_length == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_208,0,(char *)local_208._M_string_length,0x5937a0);
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_208,0,(char *)local_208._M_string_length,0x5937e5);
      psVar11 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      std::__cxx11::string::_M_append((char *)&local_208,(ulong)(psVar11->_M_dataplus)._M_p);
    }
    std::__cxx11::string::append((char *)&local_208);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->TestHandler->LogFile,local_208._M_dataplus._M_p,
                        local_208._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1dc,(char *)local_1d8,false);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x5e5069);
    std::__cxx11::string::_M_replace
              ((ulong)local_1e0,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
               0x59380b);
    (this->TestResult).Status = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2*getNumWidth(total) + 8)
    << "Start "
    << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
    << this->TestProperties->Index << ": "
    << this->TestProperties->Name << std::endl);
  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory.c_str();

  if(args.size() >= 2 && args[1] == "NOT_AVAILABLE")
    {
    this->TestProcess = new cmProcess;
    std::string msg;
    if(this->CTest->GetConfigType().empty())
      {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
      }
    else
      {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
      }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }

  // Check if all required files exist
  for(std::vector<std::string>::iterator i =
    this->TestProperties->RequiredFiles.begin();
    i != this->TestProperties->RequiredFiles.end(); ++i)
    {
    std::string file = *i;

    if(!cmSystemTools::FileExists(file.c_str()))
      {
      //Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: "
               << file << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find required file: "
               << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Not Run";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
      }
    }
  // log and return if we did not find the executable
  if (this->ActualCommand == "")
    {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: "
                   << args[1] << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Unable to find executable: "
               << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Not Run";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
    }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if(this->StopTimePassed)
    {
    return false;
    }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}